

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Breakdown * absl::lts_20250127::anon_unknown_8::InfiniteFutureBreakdown(void)

{
  long lVar1;
  Breakdown *in_RDI;
  Duration DVar2;
  Breakdown *bd;
  HiRep local_28;
  uint32_t local_20;
  
  Time::Breakdown::Breakdown(in_RDI);
  lVar1 = std::numeric_limits<long>::max();
  in_RDI->year = lVar1;
  in_RDI->month = 0xc;
  in_RDI->day = 0x1f;
  in_RDI->hour = 0x17;
  in_RDI->minute = 0x3b;
  in_RDI->second = 0x3b;
  DVar2 = InfiniteDuration();
  local_28 = DVar2.rep_hi_;
  local_20 = DVar2.rep_lo_;
  (in_RDI->subsecond).rep_hi_ = local_28;
  (in_RDI->subsecond).rep_lo_ = local_20;
  in_RDI->weekday = 4;
  in_RDI->yearday = 0x16d;
  in_RDI->offset = 0;
  in_RDI->is_dst = false;
  in_RDI->zone_abbr = "-00";
  return in_RDI;
}

Assistant:

ABSL_INTERNAL_DISABLE_DEPRECATED_DECLARATION_WARNING
inline absl::Time::Breakdown InfiniteFutureBreakdown() {
  absl::Time::Breakdown bd;
  bd.year = std::numeric_limits<int64_t>::max();
  bd.month = 12;
  bd.day = 31;
  bd.hour = 23;
  bd.minute = 59;
  bd.second = 59;
  bd.subsecond = absl::InfiniteDuration();
  bd.weekday = 4;
  bd.yearday = 365;
  bd.offset = 0;
  bd.is_dst = false;
  bd.zone_abbr = "-00";
  return bd;
}